

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O2

value_type __thiscall
FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>_>
::dx(FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>_>
     *this,int i)

{
  value_type vVar1;
  value_type vVar2;
  value_type vVar3;
  
  vVar1 = FadBinaryMul<FadCst<double>,_Fad<double>_>::dx(&this->left_->fadexpr_,i);
  vVar2 = FadFuncSin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>
          ::val(&this->right_->fadexpr_);
  vVar3 = FadFuncSin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>
          ::dx(&this->right_->fadexpr_,i);
  return vVar3 * (this->left_->fadexpr_).left_.constant_ * ((this->left_->fadexpr_).right_)->val_ +
         vVar2 * vVar1;
}

Assistant:

const value_type dx(int i) const {return  left_.dx(i) * right_.val() + right_.dx(i) * left_.val();}